

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ReceivedServerConnect(Curl_easy *data,_Bool *received)

{
  dynbuf *s;
  curl_socket_t readfd0;
  curl_socket_t readfd1;
  connectdata *pcVar1;
  curl_trc_feat *pcVar2;
  _Bool *p_Var3;
  uint uVar4;
  int iVar5;
  CURLcode CVar6;
  timediff_t tVar7;
  size_t sVar8;
  char *pcVar9;
  long slnum;
  bool bVar10;
  int ftpcode;
  ssize_t nread;
  uint local_44;
  _Bool *local_40;
  ssize_t local_38;
  
  pcVar1 = data->conn;
  readfd0 = pcVar1->sock[0];
  readfd1 = pcVar1->sock[1];
  *received = false;
  tVar7 = ftp_timeleft_accept(data);
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
     ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
    Curl_infof(data,"Checking for server connect");
  }
  if (tVar7 < 0) {
    Curl_failf(data,"Accept timeout occurred while waiting server connect");
    return CURLE_FTP_ACCEPT_TIMEOUT;
  }
  s = &(pcVar1->proto).ftpc.pp.recvbuf;
  sVar8 = Curl_dyn_len(s);
  if ((sVar8 == 0) || (pcVar9 = Curl_dyn_ptr(s), *pcVar9 < '4')) {
    bVar10 = (pcVar1->proto).ftpc.pp.overflow == 0;
    local_40 = received;
    if (bVar10) {
      uVar4 = Curl_socket_check(readfd0,readfd1,-1,0);
    }
    else {
      uVar4 = 0;
    }
    bVar10 = !bVar10;
    if (uVar4 != 0) {
      if (uVar4 == 0xffffffff) {
        Curl_failf(data,"Error while waiting for server connect");
        goto LAB_0012d8e6;
      }
      if ((uVar4 & 8) == 0) {
        bVar10 = (uVar4 & 1) != 0 || bVar10;
      }
      else {
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))
           )) {
          Curl_infof(data,"Ready to accept data connection from server");
        }
        *local_40 = true;
      }
    }
    CVar6 = CURLE_OK;
    if (bVar10) {
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        Curl_infof(data,"Ctrl conn has data while waiting for data conn");
      }
      p_Var3 = local_40;
      if (3 < (pcVar1->proto).ftpc.pp.overflow) {
        pcVar9 = Curl_dyn_ptr(s);
        sVar8 = (pcVar1->proto).ftpc.pp.nfinal;
        if (((((byte)(pcVar9[sVar8] - 0x30U) < 10) &&
             (pcVar9 = pcVar9 + sVar8, (byte)(pcVar9[1] - 0x30U) < 10)) &&
            ((byte)(pcVar9[2] - 0x30U) < 10)) && (pcVar9[3] == ' ')) {
          slnum = strtol(pcVar9,(char **)0x0,10);
          iVar5 = curlx_sltosi(slnum);
          if (iVar5 == 0xe2) {
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                (0 < pcVar2->log_level)))) {
              Curl_infof(data,"Got 226 before data activity");
            }
            *p_Var3 = true;
            return CURLE_OK;
          }
        }
      }
      Curl_GetFTPResponse(data,&local_38,(int *)&local_44);
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        Curl_infof(data,"FTP code: %03d",(ulong)local_44);
      }
      CVar6 = (uint)(399 < (int)local_44) * 2 + CURLE_WEIRD_SERVER_REPLY;
    }
  }
  else {
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      Curl_infof(data,"There is negative response in cache while serv connect");
    }
    Curl_GetFTPResponse(data,&local_38,(int *)&local_44);
LAB_0012d8e6:
    CVar6 = CURLE_FTP_ACCEPT_FAILED;
  }
  return CVar6;
}

Assistant:

static CURLcode ReceivedServerConnect(struct Curl_easy *data, bool *received)
{
  struct connectdata *conn = data->conn;
  curl_socket_t ctrl_sock = conn->sock[FIRSTSOCKET];
  curl_socket_t data_sock = conn->sock[SECONDARYSOCKET];
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  int socketstate = 0;
  timediff_t timeout_ms;
  ssize_t nread;
  int ftpcode;
  bool response = FALSE;

  *received = FALSE;

  timeout_ms = ftp_timeleft_accept(data);
  infof(data, "Checking for server connect");
  if(timeout_ms < 0) {
    /* if a timeout was already reached, bail out */
    failf(data, "Accept timeout occurred while waiting server connect");
    return CURLE_FTP_ACCEPT_TIMEOUT;
  }

  /* First check whether there is a cached response from server */
  if(Curl_dyn_len(&pp->recvbuf) && (*Curl_dyn_ptr(&pp->recvbuf) > '3')) {
    /* Data connection could not be established, let's return */
    infof(data, "There is negative response in cache while serv connect");
    (void)Curl_GetFTPResponse(data, &nread, &ftpcode);
    return CURLE_FTP_ACCEPT_FAILED;
  }

  if(pp->overflow)
    /* there is pending control data still in the buffer to read */
    response = TRUE;
  else
    socketstate = Curl_socket_check(ctrl_sock, data_sock, CURL_SOCKET_BAD, 0);

  /* see if the connection request is already here */
  switch(socketstate) {
  case -1: /* error */
    /* let's die here */
    failf(data, "Error while waiting for server connect");
    return CURLE_FTP_ACCEPT_FAILED;
  case 0:  /* Server connect is not received yet */
    break; /* loop */
  default:
    if(socketstate & CURL_CSELECT_IN2) {
      infof(data, "Ready to accept data connection from server");
      *received = TRUE;
    }
    else if(socketstate & CURL_CSELECT_IN)
      response = TRUE;
    break;
  }
  if(response) {
    infof(data, "Ctrl conn has data while waiting for data conn");
    if(pp->overflow > 3) {
      char *r = Curl_dyn_ptr(&pp->recvbuf);

      DEBUGASSERT((pp->overflow + pp->nfinal) <=
                  Curl_dyn_len(&pp->recvbuf));
      /* move over the most recently handled response line */
      r += pp->nfinal;

      if(LASTLINE(r)) {
        int status = curlx_sltosi(strtol(r, NULL, 10));
        if(status == 226) {
          /* funny timing situation where we get the final message on the
             control connection before traffic on the data connection has been
             noticed. Leave the 226 in there and use this as a trigger to read
             the data socket. */
          infof(data, "Got 226 before data activity");
          *received = TRUE;
          return CURLE_OK;
        }
      }
    }

    (void)Curl_GetFTPResponse(data, &nread, &ftpcode);

    infof(data, "FTP code: %03d", ftpcode);

    if(ftpcode/100 > 3)
      return CURLE_FTP_ACCEPT_FAILED;

    return CURLE_WEIRD_SERVER_REPLY;
  }

  return CURLE_OK;
}